

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

LinkedModel * __thiscall
google::protobuf::Arena::DoCreateMessage<CoreML::Specification::LinkedModel>(Arena *this)

{
  void *ptr;
  LinkedModel *pLVar1;
  Arena *local_18;
  Arena *local_10;
  Arena *this_local;
  
  local_10 = this;
  ptr = AllocateInternal(this,0x20,8,(_func_void_void_ptr *)0x0,
                         (type_info *)&CoreML::Specification::LinkedModel::typeinfo);
  local_18 = this;
  pLVar1 = InternalHelper<CoreML::Specification::LinkedModel>::Construct<google::protobuf::Arena*>
                     (ptr,&local_18);
  return pLVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }